

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O0

void __thiscall choc::value::Value::addMember<double>(Value *this,string_view name,double v)

{
  string_view name_00;
  Type local_58;
  Value *local_38;
  char *pcStack_30;
  double local_28;
  double v_local;
  Value *this_local;
  string_view name_local;
  
  pcStack_30 = name._M_str;
  local_38 = (Value *)name._M_len;
  local_28 = v;
  v_local = (double)this;
  this_local = local_38;
  name_local._M_len = (size_t)pcStack_30;
  Type::createFloat64();
  name_00._M_str = pcStack_30;
  name_00._M_len = (size_t)local_38;
  appendMember(this,name_00,&local_58,&local_28,8);
  Type::~Type(&local_58);
  return;
}

Assistant:

void Value::addMember (std::string_view name, MemberType v, Others&&... others)
{
    static_assert ((sizeof...(others) & 1) == 0, "The arguments must be a sequence of name, value pairs");

    static_assert (isPrimitiveType<MemberType>() || isStringType<MemberType>() || isValueType<MemberType>(),
                   "The template type needs to be one of the supported primitive types");

    if constexpr (isValueType<MemberType>())
    {
        value.type.addObjectMember (name, v.getType());
        appendValue (v);
    }
    else if constexpr (isStringType<MemberType>())
    {
        auto stringHandle = dictionary.getHandleForString (v);
        appendMember (name, Type::createString(), std::addressof (stringHandle.handle), sizeof (stringHandle.handle));
    }
    else if constexpr (matchesType<MemberType, int32_t>())   { appendMember (name, Type::createInt32(),   std::addressof (v), sizeof (v)); }
    else if constexpr (matchesType<MemberType, int64_t>())   { appendMember (name, Type::createInt64(),   std::addressof (v), sizeof (v)); }
    else if constexpr (matchesType<MemberType, float>())     { appendMember (name, Type::createFloat32(), std::addressof (v), sizeof (v)); }
    else if constexpr (matchesType<MemberType, double>())    { appendMember (name, Type::createFloat64(), std::addressof (v), sizeof (v)); }
    else if constexpr (matchesType<MemberType, bool>())      { uint8_t b = v ? 1 : 0; appendMember (name, Type::createBool(), std::addressof (b), sizeof (b)); }

    if constexpr (sizeof...(others) != 0)
        addMember (std::forward<Others> (others)...);
}